

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

void __thiscall bandit::context::bandit::~bandit(bandit *this)

{
  bandit *this_local;
  
  (this->super_interface)._vptr_interface = (_func_int **)&PTR__bandit_00142be0;
  std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~list
            (&this->after_eaches_);
  std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~list
            (&this->before_eaches_);
  std::__cxx11::string::~string((string *)&this->desc_);
  interface::~interface(&this->super_interface);
  return;
}

Assistant:

bandit(const std::string& desc, bool hard_skip_a)
          : desc_(desc), hard_skip_(hard_skip_a), is_executing_(false) {}